

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O0

int Dch_NodeIsConst(void *p,Aig_Obj_t *pObj)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint *puVar4;
  int local_34;
  int nWords;
  int k;
  uint *pSim;
  Vec_Ptr_t *vSims;
  Aig_Obj_t *pObj_local;
  void *p_local;
  
  pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
  pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
  iVar1 = (int)((long)pvVar2 - (long)pvVar3 >> 2);
  puVar4 = Dch_ObjSim((Vec_Ptr_t *)p,pObj);
  if ((*(ulong *)&pObj->field_0x18 >> 3 & 1) == 0) {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      if (puVar4[local_34] != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      if (puVar4[local_34] != 0xffffffff) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Dch_NodeIsConst( void * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim  = Dch_ObjSim( vSims, pObj );
    if ( pObj->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( ~pSim[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim[k] )
                return 0;
    }
    return 1;
}